

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall
Gluco::Solver::minimisationWithBinaryResolution(Solver *this,vec<Gluco::Lit> *out_learnt)

{
  Lit *pLVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  vec<Gluco::Solver::Watcher> *pvVar10;
  int k;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar4 = computeLBD(this,out_learnt,-1);
  if (uVar4 <= this->lbLBDMinimizingClause) {
    pLVar1 = out_learnt->data;
    iVar7 = pLVar1->x;
    uVar4 = this->MYFLAG + 1;
    this->MYFLAG = uVar4;
    puVar2 = (this->permDiff).data;
    for (lVar9 = 1; lVar9 < out_learnt->sz; lVar9 = lVar9 + 1) {
      puVar2[pLVar1[lVar9].x >> 1] = uVar4;
    }
    pvVar10 = (this->watchesBin).occs.data + ((long)iVar7 ^ 1);
    iVar7 = 0;
    for (lVar9 = 0; lVar9 < pvVar10->sz; lVar9 = lVar9 + 1) {
      iVar5 = pvVar10->data[lVar9].blocker.x;
      iVar6 = iVar5 >> 1;
      if ((this->permDiff).data[iVar6] == this->MYFLAG) {
        uStack_38 = CONCAT17((byte)iVar5 & 1 ^ (this->assigns).data[iVar6].value,
                             (undefined7)uStack_38);
        bVar3 = lbool::operator==((lbool *)((long)&uStack_38 + 7),(lbool)0x0);
        if (bVar3) {
          iVar7 = iVar7 + 1;
          (this->permDiff).data[iVar6] = this->MYFLAG - 1;
        }
      }
    }
    if (0 < iVar7) {
      iVar6 = out_learnt->sz;
      this->nbReducedClauses = this->nbReducedClauses + 1;
      iVar5 = iVar6 + -1;
      pLVar1 = out_learnt->data;
      puVar2 = (this->permDiff).data;
      for (iVar8 = 1; iVar8 < iVar6 - iVar7; iVar8 = iVar8 + 1) {
        if (puVar2[pLVar1[iVar8].x >> 1] != this->MYFLAG) {
          iVar6 = pLVar1[iVar5].x;
          pLVar1[iVar5].x = pLVar1[iVar8].x;
          pLVar1[iVar8].x = iVar6;
          iVar5 = iVar5 + -1;
          iVar8 = iVar8 + -1;
          iVar6 = out_learnt->sz;
        }
      }
      vec<Gluco::Lit>::shrink(out_learnt,iVar7);
    }
  }
  return;
}

Assistant:

void Solver::minimisationWithBinaryResolution(vec<Lit> &out_learnt) {
  
  // Find the LBD measure                                                                                                         
  unsigned int lbd = computeLBD(out_learnt);
  Lit p = ~out_learnt[0];
  
  if(lbd<=lbLBDMinimizingClause){
    MYFLAG++;
    
    for(int i = 1;i<out_learnt.size();i++) {
      permDiff[var(out_learnt[i])] = MYFLAG;
    }

    vec<Watcher>&  wbin  = watchesBin[p];
    int nb = 0;
    for(int k = 0;k<wbin.size();k++) {
      Lit imp = wbin[k].blocker;
      if(permDiff[var(imp)]==MYFLAG && value(imp)==l_True) {
        nb++;
        permDiff[var(imp)]= MYFLAG-1;
      }
      }
    int l = out_learnt.size()-1;
    if(nb>0) {
      nbReducedClauses++;
      for(int i = 1;i<out_learnt.size()-nb;i++) {
        if(permDiff[var(out_learnt[i])]!=MYFLAG) {
          Lit p = out_learnt[l];
          out_learnt[l] = out_learnt[i];
          out_learnt[i] = p;
          l--;i--;
        }
      }
      
      out_learnt.shrink(nb);
      
    }
  }
}